

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.h
# Opt level: O1

void __thiscall
glslang::HlslTokenStream::HlslTokenStream(HlslTokenStream *this,HlslScanContext *scanner)

{
  undefined8 *puVar1;
  TPoolAllocator *pTVar2;
  long lVar3;
  
  this->_vptr_HlslTokenStream = (_func_int **)&PTR__HlslTokenStream_0093c3a8;
  lVar3 = 0;
  (this->token).field_2.string = (TString *)0x0;
  (this->token).loc.name = (TString *)0x0;
  (this->token).loc.string = 0;
  (this->token).loc.line = 0;
  (this->token).loc.column = 0;
  this->scanner = scanner;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = GetThreadPoolAllocator();
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = pTVar2;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.allocator =
       (TPoolAllocator *)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pTVar2 = GetThreadPoolAllocator();
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.allocator =
       pTVar2;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = GetThreadPoolAllocator();
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Tp_alloc_type.allocator = pTVar2;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    *(undefined8 *)((long)&this->preTokenStack[0].field_2 + lVar3) = 0;
    puVar1 = (undefined8 *)((long)&this->preTokenStack[0].loc.name + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&this->preTokenStack[0].loc.column + lVar3) = 0;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x50);
  this->preTokenStackSize = 0;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&this->tokenBuffer[0].field_2 + lVar3) = 0;
    puVar1 = (undefined8 *)((long)&this->tokenBuffer[0].loc.name + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&this->tokenBuffer[0].loc.column + lVar3) = 0;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x50);
  this->tokenBufferPos = 0;
  return;
}

Assistant:

explicit HlslTokenStream(HlslScanContext& scanner)
            : scanner(scanner), preTokenStackSize(0), tokenBufferPos(0) { }